

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O3

int Sbd_ManCutServerFirst(Sbd_Srv_t *p,int iObj,int *pLeaves)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int LevStop;
  Vec_Int_t *vCut;
  long lVar4;
  int in_stack_ffffffffffffffb8;
  
  if ((iObj < 0) || (p->vLutLevs->nSize <= iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar2 = p->vLutLevs->pArray[(uint)iObj];
  LevStop = iVar2 + -2;
  p->vCut->nSize = 0;
  Gia_ManIncrementTravId(p->pGia);
  iVar1 = Sbd_ManCutCollect_rec(p->pGia,p->vMirrors,iObj,LevStop,p->vLutLevs,p->vCut);
  if (iVar1 == 0) {
    return -1;
  }
  qsort(p->vCut->pArray,(long)p->vCut->nSize,4,Vec_IntSortCompare1);
  Sbd_ManCutExpand(p->pGia,p->vMirrors,p->vLutLevs,p->vCut);
  Sbd_ManCutReload(p->vMirrors,p->vLutLevs,LevStop,p->vCut,p->vCutTop,p->vCutBot);
  vCut = p->vCut;
  iVar1 = vCut->nSize;
  iVar3 = p->nCutSize;
  if ((iVar3 < iVar1) || (p->nLutSize <= p->vCutTop->nSize)) {
    p_00 = p->vCut0;
    p_00->nSize = 0;
    iVar1 = vCut->nSize;
    if (0 < iVar1) {
      lVar4 = 0;
      do {
        Vec_IntPush(p_00,vCut->pArray[lVar4]);
        lVar4 = lVar4 + 1;
      } while (lVar4 < vCut->nSize);
      vCut = p->vCut;
      iVar1 = vCut->nSize;
      iVar3 = p->nCutSize;
    }
    if (iVar1 < iVar3) {
      iVar1 = Sbd_ManCutReduceTop(p->pGia,p->vMirrors,iObj,p->vLutLevs,vCut,p->vCutTop,
                                  in_stack_ffffffffffffffb8);
      vCut = p->vCut;
      if (iVar1 != 0) {
        Sbd_ManCutExpand(p->pGia,p->vMirrors,p->vLutLevs,vCut);
        Sbd_ManCutReload(p->vMirrors,p->vLutLevs,LevStop,p->vCut,p->vCutTop,p->vCutBot);
        vCut = p->vCut;
        iVar1 = vCut->nSize;
        if (p->nCutSize < iVar1) {
          __assert_fail("Vec_IntSize(p->vCut) <= p->nCutSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                        ,0x15a,"int Sbd_ManCutServerFirst(Sbd_Srv_t *, int, int *)");
        }
        if (p->vCutTop->nSize < p->nLutSize) goto LAB_005477a9;
        if (iVar1 < p->nCutSize) {
          iVar1 = Sbd_ManCutReduceTop(p->pGia,p->vMirrors,iObj,p->vLutLevs,vCut,p->vCutTop,
                                      in_stack_ffffffffffffffb8);
          vCut = p->vCut;
          if (iVar1 != 0) {
            Sbd_ManCutExpand(p->pGia,p->vMirrors,p->vLutLevs,vCut);
            Sbd_ManCutReload(p->vMirrors,p->vLutLevs,LevStop,p->vCut,p->vCutTop,p->vCutBot);
            vCut = p->vCut;
            iVar1 = vCut->nSize;
            if (p->nCutSize < iVar1) {
              __assert_fail("Vec_IntSize(p->vCut) <= p->nCutSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                            ,0x166,"int Sbd_ManCutServerFirst(Sbd_Srv_t *, int, int *)");
            }
            if (p->vCutTop->nSize < p->nLutSize) goto LAB_005477a9;
            if (iVar1 < p->nCutSize) {
              iVar1 = Sbd_ManCutReduceTop(p->pGia,p->vMirrors,iObj,p->vLutLevs,vCut,p->vCutTop,
                                          in_stack_ffffffffffffffb8);
              vCut = p->vCut;
              if (iVar1 != 0) {
                Sbd_ManCutExpand(p->pGia,p->vMirrors,p->vLutLevs,vCut);
                Sbd_ManCutReload(p->vMirrors,p->vLutLevs,LevStop,p->vCut,p->vCutTop,p->vCutBot);
                vCut = p->vCut;
                iVar1 = vCut->nSize;
                if (p->nCutSize < iVar1) {
                  __assert_fail("Vec_IntSize(p->vCut) <= p->nCutSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                                ,0x172,"int Sbd_ManCutServerFirst(Sbd_Srv_t *, int, int *)");
                }
                if (p->vCutTop->nSize < p->nLutSize) goto LAB_005477a9;
                if (iVar1 < p->nCutSize) {
                  iVar1 = Sbd_ManCutReduceTop(p->pGia,p->vMirrors,iObj,p->vLutLevs,vCut,p->vCutTop,
                                              in_stack_ffffffffffffffb8);
                  vCut = p->vCut;
                  if (iVar1 != 0) {
                    Sbd_ManCutExpand(p->pGia,p->vMirrors,p->vLutLevs,vCut);
                    Sbd_ManCutReload(p->vMirrors,p->vLutLevs,LevStop,p->vCut,p->vCutTop,p->vCutBot);
                    vCut = p->vCut;
                    iVar1 = vCut->nSize;
                    if (p->nCutSize < iVar1) {
                      __assert_fail("Vec_IntSize(p->vCut) <= p->nCutSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                                    ,0x17e,"int Sbd_ManCutServerFirst(Sbd_Srv_t *, int, int *)");
                    }
                    if (p->vCutTop->nSize < p->nLutSize) goto LAB_005477a9;
                  }
                }
              }
            }
          }
        }
      }
    }
    vCut->nSize = 0;
    Gia_ManIncrementTravId(p->pGia);
    iVar2 = Sbd_ManCutCollect_rec(p->pGia,p->vMirrors,iObj,iVar2 + -3,p->vLutLevs,p->vCut);
    if (iVar2 == 0) {
      return -1;
    }
    qsort(p->vCut->pArray,(long)p->vCut->nSize,4,Vec_IntSortCompare1);
    Sbd_ManCutExpand(p->pGia,p->vMirrors,p->vLutLevs,p->vCut);
    Sbd_ManCutReload(p->vMirrors,p->vLutLevs,LevStop,p->vCut,p->vCutTop,p->vCutBot);
    vCut = p->vCut;
    iVar1 = vCut->nSize;
    if (p->nCutSize < iVar1) {
      return -1;
    }
    if (p->nLutSize <= p->vCutTop->nSize) {
      return -1;
    }
  }
LAB_005477a9:
  memcpy(pLeaves,vCut->pArray,(long)iVar1 << 2);
  return p->vCut->nSize;
}

Assistant:

int Sbd_ManCutServerFirst( Sbd_Srv_t * p, int iObj, int * pLeaves )
{
    int RetValue, LevStop = Vec_IntEntry(p->vLutLevs, iObj) - 2;

    Vec_IntClear( p->vCut );
    Gia_ManIncrementTravId( p->pGia );
    RetValue = Sbd_ManCutCollect_rec( p->pGia, p->vMirrors, iObj, LevStop, p->vLutLevs, p->vCut );
    if ( RetValue == 0 ) // cannot build delay-improving cut
        return -1;
    // check if the current cut is good
    Vec_IntSort( p->vCut, 0 );
/*
    Sbd_ManCutReload( p->vMirrors, p->vLutLevs, LevStop, p->vCut, p->vCutTop, p->vCutBot );
    if ( Vec_IntSize(p->vCut) <= p->nCutSize && Vec_IntSize(p->vCutTop) <= p->nLutSize-1 )
    {
        //printf( "%d ", Vec_IntSize(p->vCut) );
        memcpy( pLeaves, Vec_IntArray(p->vCut), sizeof(int) * Vec_IntSize(p->vCut) );
        return Vec_IntSize(p->vCut);
    }
*/
    // try to expand the cut
    Sbd_ManCutExpand( p->pGia, p->vMirrors, p->vLutLevs, p->vCut );
    Sbd_ManCutReload( p->vMirrors, p->vLutLevs, LevStop, p->vCut, p->vCutTop, p->vCutBot );
    if ( Vec_IntSize(p->vCut) <= p->nCutSize && Vec_IntSize(p->vCutTop) <= p->nLutSize-1 )
    {
        //printf( "1=(%d,%d) ", Vec_IntSize(p->vCutTop), Vec_IntSize(p->vCutBot) );
        //printf( "%d ", Vec_IntSize(p->vCut) );
        memcpy( pLeaves, Vec_IntArray(p->vCut), sizeof(int) * Vec_IntSize(p->vCut) );
        return Vec_IntSize(p->vCut);
    }

    // try to reduce the topmost
    Vec_IntClear( p->vCut0 );
    Vec_IntAppend( p->vCut0, p->vCut );
    if ( Vec_IntSize(p->vCut) < p->nCutSize && Sbd_ManCutReduceTop( p->pGia, p->vMirrors, iObj, p->vLutLevs, p->vCut, p->vCutTop, p->nCutSize ) )
    {
        Sbd_ManCutExpand( p->pGia, p->vMirrors, p->vLutLevs, p->vCut );
        Sbd_ManCutReload( p->vMirrors, p->vLutLevs, LevStop, p->vCut, p->vCutTop, p->vCutBot );
        assert( Vec_IntSize(p->vCut) <= p->nCutSize );
        if ( Vec_IntSize(p->vCutTop) <= p->nLutSize-1 )
        {
            //printf( "%d -> %d (%d + %d)\n", Vec_IntSize(p->vCut0), Vec_IntSize(p->vCut), Vec_IntSize(p->vCutTop), Vec_IntSize(p->vCutBot) );
            memcpy( pLeaves, Vec_IntArray(p->vCut), sizeof(int) * Vec_IntSize(p->vCut) );
            return Vec_IntSize(p->vCut);
        }
        // try again
        if ( Vec_IntSize(p->vCut) < p->nCutSize && Sbd_ManCutReduceTop( p->pGia, p->vMirrors, iObj, p->vLutLevs, p->vCut, p->vCutTop, p->nCutSize ) )
        {
            Sbd_ManCutExpand( p->pGia, p->vMirrors, p->vLutLevs, p->vCut );
            Sbd_ManCutReload( p->vMirrors, p->vLutLevs, LevStop, p->vCut, p->vCutTop, p->vCutBot );
            assert( Vec_IntSize(p->vCut) <= p->nCutSize );
            if ( Vec_IntSize(p->vCutTop) <= p->nLutSize-1 )
            {
                //printf( "* %d -> %d (%d + %d)\n", Vec_IntSize(p->vCut0), Vec_IntSize(p->vCut), Vec_IntSize(p->vCutTop), Vec_IntSize(p->vCutBot) );
                memcpy( pLeaves, Vec_IntArray(p->vCut), sizeof(int) * Vec_IntSize(p->vCut) );
                return Vec_IntSize(p->vCut);
            }
            // try again
            if ( Vec_IntSize(p->vCut) < p->nCutSize && Sbd_ManCutReduceTop( p->pGia, p->vMirrors, iObj, p->vLutLevs, p->vCut, p->vCutTop, p->nCutSize ) )
            {
                Sbd_ManCutExpand( p->pGia, p->vMirrors, p->vLutLevs, p->vCut );
                Sbd_ManCutReload( p->vMirrors, p->vLutLevs, LevStop, p->vCut, p->vCutTop, p->vCutBot );
                assert( Vec_IntSize(p->vCut) <= p->nCutSize );
                if ( Vec_IntSize(p->vCutTop) <= p->nLutSize-1 )
                {
                    //printf( "** %d -> %d (%d + %d)\n", Vec_IntSize(p->vCut0), Vec_IntSize(p->vCut), Vec_IntSize(p->vCutTop), Vec_IntSize(p->vCutBot) );
                    memcpy( pLeaves, Vec_IntArray(p->vCut), sizeof(int) * Vec_IntSize(p->vCut) );
                    return Vec_IntSize(p->vCut);
                }
                // try again
                if ( Vec_IntSize(p->vCut) < p->nCutSize && Sbd_ManCutReduceTop( p->pGia, p->vMirrors, iObj, p->vLutLevs, p->vCut, p->vCutTop, p->nCutSize ) )
                {
                    Sbd_ManCutExpand( p->pGia, p->vMirrors, p->vLutLevs, p->vCut );
                    Sbd_ManCutReload( p->vMirrors, p->vLutLevs, LevStop, p->vCut, p->vCutTop, p->vCutBot );
                    assert( Vec_IntSize(p->vCut) <= p->nCutSize );
                    if ( Vec_IntSize(p->vCutTop) <= p->nLutSize-1 )
                    {
                        //printf( "*** %d -> %d (%d + %d)\n", Vec_IntSize(p->vCut0), Vec_IntSize(p->vCut), Vec_IntSize(p->vCutTop), Vec_IntSize(p->vCutBot) );
                        memcpy( pLeaves, Vec_IntArray(p->vCut), sizeof(int) * Vec_IntSize(p->vCut) );
                        return Vec_IntSize(p->vCut);
                    }
                }
            }
        }
    }

    // recompute the cut
    Vec_IntClear( p->vCut );
    Gia_ManIncrementTravId( p->pGia );
    RetValue = Sbd_ManCutCollect_rec( p->pGia, p->vMirrors, iObj, LevStop-1, p->vLutLevs, p->vCut );
    if ( RetValue == 0 ) // cannot build delay-improving cut
        return -1;
    // check if the current cut is good
    Vec_IntSort( p->vCut, 0 );
/*
    Sbd_ManCutReload( p->vMirrors, p->vLutLevs, LevStop, p->vCut, p->vCutTop, p->vCutBot );
    if ( Vec_IntSize(p->vCut) <= p->nCutSize && Vec_IntSize(p->vCutTop) <= p->nLutSize-1 )
    {
        //printf( "%d ", Vec_IntSize(p->vCut) );
        memcpy( pLeaves, Vec_IntArray(p->vCut), sizeof(int) * Vec_IntSize(p->vCut) );
        return Vec_IntSize(p->vCut);
    }
*/
    // try to expand the cut
    Sbd_ManCutExpand( p->pGia, p->vMirrors, p->vLutLevs, p->vCut );
    Sbd_ManCutReload( p->vMirrors, p->vLutLevs, LevStop, p->vCut, p->vCutTop, p->vCutBot );
    if ( Vec_IntSize(p->vCut) <= p->nCutSize && Vec_IntSize(p->vCutTop) <= p->nLutSize-1 )
    {
        //printf( "2=(%d,%d) ", Vec_IntSize(p->vCutTop), Vec_IntSize(p->vCutBot) );
        //printf( "%d ", Vec_IntSize(p->vCut) );
        memcpy( pLeaves, Vec_IntArray(p->vCut), sizeof(int) * Vec_IntSize(p->vCut) );
        return Vec_IntSize(p->vCut);
    }

    return -1;
}